

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

int __thiscall musicBlock::releaseSustain(musicBlock *this,uint channel)

{
  uchar *puVar1;
  ulong uVar2;
  
  puVar1 = &this->channels[0].flags;
  for (uVar2 = 0; uVar2 < this->io->OPLchannels; uVar2 = uVar2 + 1) {
    if ((((channelEntry *)(puVar1 + -2))->channel == channel) && ((*puVar1 & 2) != 0)) {
      releaseChannel(this,(uint)uVar2,0);
    }
    puVar1 = puVar1 + 0x28;
  }
  return 0;
}

Assistant:

int musicBlock::releaseSustain(uint channel)
{
	uint i;
	uint id = channel;

	for(i = 0; i < io->OPLchannels; i++)
	{
		if (channels[i].channel == id && channels[i].flags & CH_SUSTAIN)
			releaseChannel(i, 0);
	}
	return 0;
}